

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall google::protobuf::FieldDescriptorProto::SharedDtor(FieldDescriptorProto *this)

{
  string *psVar1;
  FieldDescriptorProto *this_local;
  
  if ((this->name_ != (string *)internal::kEmptyString_abi_cxx11_) &&
     (psVar1 = this->name_, psVar1 != (string *)0x0)) {
    std::__cxx11::string::~string((string *)psVar1);
    operator_delete(psVar1,0x20);
  }
  if ((this->type_name_ != (string *)internal::kEmptyString_abi_cxx11_) &&
     (psVar1 = this->type_name_, psVar1 != (string *)0x0)) {
    std::__cxx11::string::~string((string *)psVar1);
    operator_delete(psVar1,0x20);
  }
  if ((this->extendee_ != (string *)internal::kEmptyString_abi_cxx11_) &&
     (psVar1 = this->extendee_, psVar1 != (string *)0x0)) {
    std::__cxx11::string::~string((string *)psVar1);
    operator_delete(psVar1,0x20);
  }
  if ((this->default_value_ != (string *)internal::kEmptyString_abi_cxx11_) &&
     (psVar1 = this->default_value_, psVar1 != (string *)0x0)) {
    std::__cxx11::string::~string((string *)psVar1);
    operator_delete(psVar1,0x20);
  }
  if ((this != default_instance_) && (this->options_ != (FieldOptions *)0x0)) {
    (*(this->options_->super_Message).super_MessageLite._vptr_MessageLite[1])();
  }
  return;
}

Assistant:

void FieldDescriptorProto::SharedDtor() {
  if (name_ != &::google::protobuf::internal::kEmptyString) {
    delete name_;
  }
  if (type_name_ != &::google::protobuf::internal::kEmptyString) {
    delete type_name_;
  }
  if (extendee_ != &::google::protobuf::internal::kEmptyString) {
    delete extendee_;
  }
  if (default_value_ != &::google::protobuf::internal::kEmptyString) {
    delete default_value_;
  }
  if (this != default_instance_) {
    delete options_;
  }
}